

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_noise.c
# Opt level: O2

void fe_vad_hangover(fe_t *fe,mfcc_t *feat,int32 is_speech,int32 store_pcm)

{
  vad_data_t *pvVar1;
  short sVar2;
  
  if (fe->vad_data->in_speech == '\0') {
    fe_prespch_write_cep(fe->vad_data->prespch_buf,feat);
    if (store_pcm != 0) {
      fe_prespch_write_pcm(fe->vad_data->prespch_buf,fe->spch);
    }
  }
  pvVar1 = fe->vad_data;
  if (is_speech == 0) {
    pvVar1->pre_speech_frames = 0;
    if ((pvVar1->in_speech != '\0') &&
       (sVar2 = (short)*(undefined4 *)&pvVar1->post_speech_frames + 1,
       pvVar1->post_speech_frames = sVar2, fe->post_speech <= sVar2)) {
      pvVar1->post_speech_frames = 0;
      pvVar1->in_speech = '\0';
      fe_prespch_reset_cep(pvVar1->prespch_buf);
      fe_prespch_reset_pcm(fe->vad_data->prespch_buf);
      return;
    }
  }
  else {
    pvVar1->post_speech_frames = 0;
    if ((pvVar1->in_speech == '\0') &&
       (sVar2 = pvVar1->pre_speech_frames + 1, pvVar1->pre_speech_frames = sVar2,
       fe->start_speech <= sVar2)) {
      pvVar1->pre_speech_frames = 0;
      pvVar1->in_speech = '\x01';
    }
  }
  return;
}

Assistant:

void
fe_vad_hangover(fe_t * fe, mfcc_t * feat, int32 is_speech, int32 store_pcm)
{
    if (!fe->vad_data->in_speech) {
        fe_prespch_write_cep(fe->vad_data->prespch_buf, feat);
        if (store_pcm)
            fe_prespch_write_pcm(fe->vad_data->prespch_buf, fe->spch);
    }
    
    /* track vad state and deal with cepstrum prespeech buffer */
    if (is_speech) {
        fe->vad_data->post_speech_frames = 0;
        if (!fe->vad_data->in_speech) {
            fe->vad_data->pre_speech_frames++;
            /* check for transition sil->speech */
            if (fe->vad_data->pre_speech_frames >= fe->start_speech) {
                fe->vad_data->pre_speech_frames = 0;
                fe->vad_data->in_speech = 1;
            }
        }
    } else {
        fe->vad_data->pre_speech_frames = 0;
        if (fe->vad_data->in_speech) {
            fe->vad_data->post_speech_frames++;
            /* check for transition speech->sil */
            if (fe->vad_data->post_speech_frames >= fe->post_speech) {
                fe->vad_data->post_speech_frames = 0;
                fe->vad_data->in_speech = 0;
    	        fe_prespch_reset_cep(fe->vad_data->prespch_buf);
        	fe_prespch_reset_pcm(fe->vad_data->prespch_buf);
            }
        }
    }
}